

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void nodeGetCell(Rtree *pRtree,RtreeNode *pNode,int iCell,RtreeCell *pCell)

{
  i64 iVar1;
  i64 *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int ii;
  RtreeCoord *pCoord;
  u8 *pData;
  uint in_stack_ffffffffffffffc8;
  int iVar2;
  i64 *piVar3;
  u8 *local_28;
  
  iVar2 = 0;
  iVar1 = nodeGetRowid((Rtree *)&DAT_aaaaaaaaaaaaaaaa,(RtreeNode *)(ulong)in_stack_ffffffffffffffc8,
                       0);
  *in_RCX = iVar1;
  local_28 = (u8 *)(*(long *)(in_RSI + 0x18) +
                   (long)(int)((uint)*(byte *)(in_RDI + 0x27) * in_EDX + 0xc));
  piVar3 = in_RCX + 1;
  do {
    readCoord(local_28,(RtreeCoord *)((long)piVar3 + (long)iVar2 * 4));
    readCoord(local_28 + 4,(RtreeCoord *)((long)piVar3 + (long)(iVar2 + 1) * 4));
    local_28 = local_28 + 8;
    iVar2 = iVar2 + 2;
  } while (iVar2 < (int)(uint)*(byte *)(in_RDI + 0x25));
  return;
}

Assistant:

static void nodeGetCell(
  Rtree *pRtree,               /* The overall R-Tree */
  RtreeNode *pNode,            /* The node containing the cell to be read */
  int iCell,                   /* Index of the cell within the node */
  RtreeCell *pCell             /* OUT: Write the cell contents here */
){
  u8 *pData;
  RtreeCoord *pCoord;
  int ii = 0;
  pCell->iRowid = nodeGetRowid(pRtree, pNode, iCell);
  pData = pNode->zData + (12 + pRtree->nBytesPerCell*iCell);
  pCoord = pCell->aCoord;
  do{
    readCoord(pData, &pCoord[ii]);
    readCoord(pData+4, &pCoord[ii+1]);
    pData += 8;
    ii += 2;
  }while( ii<pRtree->nDim2 );
}